

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O0

bool __thiscall pfd::internal::executor::ready(executor *this,int timeout)

{
  size_type __n;
  int *piVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_2078;
  __pid_t local_206c;
  uint local_2068;
  pid_t child;
  int status;
  allocator<char> local_2051;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2050;
  size_type local_2030;
  ssize_t received;
  char buf [8192];
  int local_1c;
  executor *peStack_18;
  int timeout_local;
  executor *this_local;
  
  if ((this->m_running & 1U) == 0) {
    return true;
  }
  local_1c = timeout;
  peStack_18 = this;
  __n = read(this->m_fd,&received,0x2000);
  local_2030 = __n;
  if ((long)__n < 1) {
    local_206c = waitpid(this->m_pid,(int *)&local_2068,1);
    if ((local_206c == this->m_pid) ||
       ((local_206c < 0 && (piVar1 = __errno_location(), *piVar1 == 10)))) {
      close(this->m_fd);
      this->m_exit_code = (int)(local_2068 & 0xff00) >> 8;
      this->m_running = false;
      this_local._7_1_ = true;
    }
    else {
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_2078,&local_1c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_2078);
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2050,(char *)&received,__n,&local_2051);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->m_stdout,&local_2050);
  std::__cxx11::string::~string((string *)&local_2050);
  std::allocator<char>::~allocator(&local_2051);
  return false;
}

Assistant:

inline bool internal::executor::ready(int timeout /* = default_wait_timeout */)
{
    if (!m_running)
        return true;

#if _WIN32
    if (m_future.valid())
    {
        auto status = m_future.wait_for(std::chrono::milliseconds(timeout));
        if (status != std::future_status::ready)
        {
            // On Windows, we need to run the message pump. If the async
            // thread uses a Windows API dialog, it may be attached to the
            // main thread and waiting for messages that only we can dispatch.
            MSG msg;
            while (PeekMessage(&msg, nullptr, 0, 0, PM_REMOVE))
            {
                TranslateMessage(&msg);
                DispatchMessage(&msg);
            }
            return false;
        }

        m_stdout = m_future.get();
    }
#elif __EMSCRIPTEN__ || __NX__
    // FIXME: do something
    (void)timeout;
#else
    char buf[BUFSIZ];
    ssize_t received = read(m_fd, buf, BUFSIZ); // Flawfinder: ignore
    if (received > 0)
    {
        m_stdout += std::string(buf, received);
        return false;
    }

    // Reap child process if it is dead. It is possible that the system has already reaped it
    // (this happens when the calling application handles or ignores SIG_CHLD) and results in
    // waitpid() failing with ECHILD. Otherwise we assume the child is running and we sleep for
    // a little while.
    int status;
    pid_t child = waitpid(m_pid, &status, WNOHANG);
    if (child != m_pid && (child >= 0 || errno != ECHILD))
    {
        // FIXME: this happens almost always at first iteration
        std::this_thread::sleep_for(std::chrono::milliseconds(timeout));
        return false;
    }

    close(m_fd);
    m_exit_code = WEXITSTATUS(status);
#endif

    m_running = false;
    return true;
}